

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

int gmath::anon_unknown_0::computeRadialDistortion
              (int n,double *x,int m,double *fvec,double *fjac,void *up)

{
  double dVar1;
  double dVar2;
  double fs;
  double f;
  double r2_1;
  double s;
  double r2;
  RadialDistortionParameter *p;
  void *up_local;
  double *fjac_local;
  double *fvec_local;
  int m_local;
  double *x_local;
  int n_local;
  
  if (fvec != (double *)0x0) {
    dVar1 = *x * *x + x[1] * x[1];
    dVar1 = *(double *)((long)up + 0x10) * dVar1 * dVar1 * dVar1 +
            *(double *)((long)up + 8) * dVar1 * dVar1 + *up * dVar1 + 1.0;
    *fvec = -*x * dVar1 + *(double *)((long)up + 0x18);
    fvec[1] = -x[1] * dVar1 + *(double *)((long)up + 0x20);
  }
  if (fjac != (double *)0x0) {
    dVar1 = *x * *x + x[1] * x[1];
    dVar2 = *(double *)((long)up + 0x10) * dVar1 * dVar1 * dVar1 +
            *(double *)((long)up + 8) * dVar1 * dVar1 + *up * dVar1 + 1.0;
    dVar1 = *(double *)((long)up + 0x10) * 3.0 * dVar1 * dVar1 +
            *(double *)((long)up + 8) * 2.0 * dVar1 + *up;
    *fjac = -(*x * 2.0 * *x * dVar1 + dVar2);
    fjac[1] = -(*x * 2.0 * x[1] * dVar1);
    fjac[2] = fjac[1];
    fjac[3] = -(x[1] * 2.0 * x[1] * dVar1 + dVar2);
  }
  return 0;
}

Assistant:

int computeRadialDistortion(int n, double x[], int m, double fvec[],
                            double fjac[], void *up)
{
  RadialDistortionParameter *p=static_cast<RadialDistortionParameter *>(up);

  if (fvec != 0)
  {
    const double r2=x[0]*x[0]+x[1]*x[1];
    const double s=1.0+p->kd[0]*r2+p->kd[1]*r2*r2+p->kd[2]*r2*r2*r2;

    fvec[0]=p->xd-x[0]*s;
    fvec[1]=p->yd-x[1]*s;
  }

  if (fjac != 0)
  {
    const double r2=x[0]*x[0]+x[1]*x[1];

    const double f=1.0+p->kd[0]*r2+p->kd[1]*r2*r2+p->kd[2]*r2*r2*r2;
    const double fs=p->kd[0]+2*p->kd[1]*r2+3*p->kd[2]*r2*r2;

    fjac[0]=-(f+2*x[0]*x[0]*fs);
    fjac[1]=-(2*x[0]*x[1]*fs);
    fjac[2]=fjac[1];
    fjac[3]=-(f+2*x[1]*x[1]*fs);
  }

  return 0;
}